

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

size_t drwav_read_raw(drwav *pWav,size_t bytesToRead,void *pBufferOut)

{
  int iVar1;
  ulong uVar2;
  long in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  size_t bytesToSeek_1;
  size_t bytesSeeked;
  drwav_uint8 buffer [4096];
  size_t bytesToSeek;
  size_t bytesRead;
  ulong local_1048;
  undefined1 local_1038 [4104];
  ulong local_30;
  ulong local_28;
  ulong local_18;
  undefined8 *local_10;
  size_t local_8;
  
  if ((in_RDI == (undefined8 *)0x0) || (in_RSI == 0)) {
    local_8 = 0;
  }
  else {
    local_18 = in_RSI;
    if ((ulong)in_RDI[0x12] < in_RSI) {
      local_18 = in_RDI[0x12];
    }
    local_10 = in_RDI;
    if (in_RDX == 0) {
      for (local_28 = 0; local_28 < local_18; local_28 = local_30 + local_28) {
        local_30 = local_18 - local_28;
        if (0x7fffffff < local_30) {
          local_30 = 0x7fffffff;
        }
        iVar1 = (*(code *)local_10[2])(local_10[3],local_30 & 0xffffffff,1);
        if (iVar1 == 0) break;
      }
      do {
        if (local_18 <= local_28) break;
        local_1048 = local_18 - local_28;
        if (0x1000 < local_1048) {
          local_1048 = 0x1000;
        }
        uVar2 = (*(code *)*local_10)(local_10[3],local_1038,local_1048);
        local_28 = uVar2 + local_28;
      } while (local_1048 <= uVar2);
    }
    else {
      local_28 = (*(code *)*in_RDI)(in_RDI[3],in_RDX,local_18);
    }
    local_10[0x12] = local_10[0x12] - local_28;
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

DRWAV_API size_t drwav_read_raw(drwav* pWav, size_t bytesToRead, void* pBufferOut)
{
    size_t bytesRead;

    if (pWav == NULL || bytesToRead == 0) {
        return 0;
    }

    if (bytesToRead > pWav->bytesRemaining) {
        bytesToRead = (size_t)pWav->bytesRemaining;
    }

    if (pBufferOut != NULL) {
        bytesRead = pWav->onRead(pWav->pUserData, pBufferOut, bytesToRead);
    } else {
        /* We need to seek. If we fail, we need to read-and-discard to make sure we get a good byte count. */
        bytesRead = 0;
        while (bytesRead < bytesToRead) {
            size_t bytesToSeek = (bytesToRead - bytesRead);
            if (bytesToSeek > 0x7FFFFFFF) {
                bytesToSeek = 0x7FFFFFFF;
            }

            if (pWav->onSeek(pWav->pUserData, (int)bytesToSeek, drwav_seek_origin_current) == DRWAV_FALSE) {
                break;
            }

            bytesRead += bytesToSeek;
        }

        /* When we get here we may need to read-and-discard some data. */
        while (bytesRead < bytesToRead) {
            drwav_uint8 buffer[4096];
            size_t bytesSeeked;
            size_t bytesToSeek = (bytesToRead - bytesRead);
            if (bytesToSeek > sizeof(buffer)) {
                bytesToSeek = sizeof(buffer);
            }

            bytesSeeked = pWav->onRead(pWav->pUserData, buffer, bytesToSeek);
            bytesRead += bytesSeeked;

            if (bytesSeeked < bytesToSeek) {
                break;  /* Reached the end. */
            }
        }
    }

    pWav->bytesRemaining -= bytesRead;
    return bytesRead;
}